

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O0

node_iterator * __thiscall YAML::detail::node_data::end(node_data *this)

{
  SeqIter seqIt;
  iterator mapIt;
  MapIter in_RSI;
  node_iterator *in_RDI;
  node_iterator_base<YAML::detail::node> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar1;
  
  if (((ulong)(in_RSI._M_current)->first & 1) == 0) {
    node_iterator_base<YAML::detail::node>::node_iterator_base
              ((node_iterator_base<YAML::detail::node> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else {
    iVar1 = *(int *)&in_RSI._M_current[1].first;
    if (iVar1 == 3) {
      std::vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>::end
                ((vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_> *)
                 in_stack_ffffffffffffffb8);
      seqIt._M_current._4_4_ = iVar1;
      seqIt._M_current._0_4_ = in_stack_ffffffffffffffc0;
      node_iterator_base<YAML::detail::node>::node_iterator_base(in_stack_ffffffffffffffb8,seqIt);
    }
    else if (iVar1 == 4) {
      std::
      vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
      ::end((vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
             *)in_stack_ffffffffffffffb8);
      mapIt = std::
              vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
              ::end((vector<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
                     *)in_stack_ffffffffffffffb8);
      node_iterator_base<YAML::detail::node>::node_iterator_base
                (in_RDI,(MapIter)mapIt._M_current,in_RSI);
    }
    else {
      node_iterator_base<YAML::detail::node>::node_iterator_base
                ((node_iterator_base<YAML::detail::node> *)CONCAT44(iVar1,in_stack_ffffffffffffffc0)
                );
    }
  }
  return in_RDI;
}

Assistant:

node_iterator node_data::end() {
  if (!m_isDefined)
    return {};

  switch (m_type) {
    case NodeType::Sequence:
      return node_iterator(m_sequence.end());
    case NodeType::Map:
      return node_iterator(m_map.end(), m_map.end());
    default:
      return {};
  }
}